

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlParseMisc(xmlParserCtxtPtr ctxt)

{
  xmlParserCtxtPtr ctxt_local;
  
  while( true ) {
    while( true ) {
      if (ctxt->instate == XML_PARSER_EOF) {
        return;
      }
      xmlSkipBlankChars(ctxt);
      if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
        xmlGROW(ctxt);
      }
      if ((*ctxt->input->cur != '<') || (ctxt->input->cur[1] != '?')) break;
      xmlParsePI(ctxt);
    }
    if (*ctxt->input->cur != '<') {
      return;
    }
    if (ctxt->input->cur[1] != '!') {
      return;
    }
    if (ctxt->input->cur[2] != '-') break;
    if (ctxt->input->cur[3] != '-') {
      return;
    }
    xmlParseComment(ctxt);
  }
  return;
}

Assistant:

void
xmlParseMisc(xmlParserCtxtPtr ctxt) {
    while (ctxt->instate != XML_PARSER_EOF) {
        SKIP_BLANKS;
        GROW;
        if ((RAW == '<') && (NXT(1) == '?')) {
	    xmlParsePI(ctxt);
        } else if (CMP4(CUR_PTR, '<', '!', '-', '-')) {
	    xmlParseComment(ctxt);
        } else {
            break;
        }
    }
}